

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.c
# Opt level: O0

int delay_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  delay_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  if (field == 1) {
    *(bool *)value = segment->mix == delay_segment_mix_bypass;
  }
  else if (field == 2) {
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x34);
  }
  else {
    if (field != 0x16) {
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x30);
  }
  return 1;
}

Assistant:

int delay_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct delay_segment_data *data = (struct delay_segment_data *)segment->data;
  switch(field){
  case MIXED_DELAY_TIME: *((float *)value) = data->time; break;
  case MIXED_SAMPLERATE: *((uint32_t *)value) = data->samplerate; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == delay_segment_mix_bypass); break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}